

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

aiColor4D __thiscall Assimp::XFileParser::ReadRGBA(XFileParser *this)

{
  aiColor4D aVar1;
  XFileParser *this_local;
  aiColor4D color;
  
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&this_local);
  this_local._0_4_ = ReadFloat(this);
  this_local._4_4_ = ReadFloat(this);
  color.r = ReadFloat(this);
  color.g = ReadFloat(this);
  TestForSeparator(this);
  aVar1.g = this_local._4_4_;
  aVar1.r = this_local._0_4_;
  aVar1.b = color.r;
  aVar1.a = color.g;
  return aVar1;
}

Assistant:

aiColor4D XFileParser::ReadRGBA()
{
    aiColor4D color;
    color.r = ReadFloat();
    color.g = ReadFloat();
    color.b = ReadFloat();
    color.a = ReadFloat();
    TestForSeparator();

    return color;
}